

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O1

obj_property * lookup_obj_property_name(char *prop_name)

{
  int iVar1;
  obj_property *poVar2;
  long lVar3;
  
  if (1 < (ulong)z_info->property_max) {
    poVar2 = obj_properties + 1;
    lVar3 = (ulong)z_info->property_max - 1;
    do {
      iVar1 = strcmp(poVar2->name,prop_name);
      if (iVar1 == 0) {
        return poVar2;
      }
      poVar2 = poVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return (obj_property *)0x0;
}

Assistant:

struct obj_property *lookup_obj_property_name(const char *prop_name)
{
	struct obj_property *prop;
	int i;

	/* Find the right property */
	for (i = 1; i < z_info->property_max; i++) {
		prop = &obj_properties[i];
		if (streq(prop->name, prop_name)) {
			return prop;
		}
	}

	return NULL;
}